

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuLaunchData.cpp
# Opt level: O3

void __thiscall
xmrig::CpuLaunchData::CpuLaunchData
          (CpuLaunchData *this,Miner *miner,CpuConfig *config,CpuThread *thread)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  
  (this->assembly).m_id = (config->m_assembly).m_id;
  this->hugePages = config->m_hugePages;
  bVar1 = CpuConfig::isHwAES(config);
  this->hwAES = bVar1;
  this->priority = config->m_priority;
  this->affinity = thread->m_affinity;
  this->miner = miner;
  uVar2 = thread->m_intensity + (uint)(thread->m_intensity == 0);
  uVar3 = 5;
  if (uVar2 < 5) {
    uVar3 = uVar2;
  }
  this->intensity = uVar3;
  return;
}

Assistant:

xmrig::CpuLaunchData::CpuLaunchData(const Miner *miner, const CpuConfig &config, const CpuThread &thread) :
    assembly(config.assembly()),
    hugePages(config.isHugePages()),
    hwAES(config.isHwAES()),
    priority(config.priority()),
    affinity(thread.affinity()),
    miner(miner),
    intensity(std::min<uint32_t>(thread.intensity(), 5))
{
}